

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::IncorrectConstruction::IncorrectConstruction
          (IncorrectConstruction *this,string *IncorrectConstruction,string *msg,ExitCodes exit_code
          )

{
  string sStack_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)IncorrectConstruction);
  ::std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  ConstructionError::ConstructionError
            (&this->super_ConstructionError,&local_48,&sStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ConstructionError).super_Error = &PTR__Error_001431b8;
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }